

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall
cmake::SetArgs(cmake *this,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *args,bool directoriesSetBefore)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ostream *poVar7;
  cmGlobalGenerator *gg;
  char *pcVar8;
  bool collapse;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  ulong extraout_RDX_13;
  pointer pbVar9;
  string *psVar10;
  uint uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  string value;
  string local_50;
  
  uVar6 = (ulong)directoriesSetBefore;
  uVar12 = 1;
  bVar2 = false;
  bVar3 = false;
  do {
    uVar11 = (uint)uVar12;
    pbVar9 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5) <= uVar12) {
      if ((directoriesSetBefore & 1U) == 0) {
        cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                  (&value,(SystemTools *)0x1,SUB81(uVar6,0));
        SetHomeOutputDirectory(this,&value);
        std::__cxx11::string::~string((string *)&value);
        cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                  (&value,(SystemTools *)0x1,collapse);
        SetHomeDirectory(this,&value);
        std::__cxx11::string::~string((string *)&value);
      }
      pcVar8 = getenv("CMAKE_DEBUGGER");
      if ((pcVar8 != (char *)0x0) && (*pcVar8 != '\0')) {
        std::__cxx11::string::string((string *)&value,pcVar8,(allocator *)&local_50);
        SetupDebugger(this,&value);
        std::__cxx11::string::~string((string *)&value);
      }
      return;
    }
    pbVar9 = pbVar9 + uVar12;
    lVar5 = std::__cxx11::string::find((char *)pbVar9,0x520fd0);
    if (lVar5 == 0) {
      std::__cxx11::string::substr((ulong)&value,(ulong)pbVar9);
      cmsys::SystemTools::CollapseFullPath(&local_50,&value);
      std::__cxx11::string::operator=((string *)&value,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      cmsys::SystemTools::ConvertToUnixSlashes(&value);
      SetHomeDirectory(this,&value);
LAB_002e9726:
      std::__cxx11::string::~string((string *)&value);
      uVar6 = extraout_RDX_00;
LAB_002e972e:
      directoriesSetBefore = true;
    }
    else {
      auVar13 = std::__cxx11::string::find((char *)pbVar9,0x513ee1);
      uVar6 = auVar13._8_8_;
      if (auVar13._0_8_ != 0) {
        auVar13 = std::__cxx11::string::find((char *)pbVar9,0x513ee4);
        uVar6 = auVar13._8_8_;
        if (auVar13._0_8_ != 0) {
          lVar5 = std::__cxx11::string::find((char *)pbVar9,0x520fd4);
          if (lVar5 == 0) {
            std::__cxx11::string::substr((ulong)&value,(ulong)pbVar9);
            cmsys::SystemTools::CollapseFullPath(&local_50,&value);
            std::__cxx11::string::operator=((string *)&value,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            cmsys::SystemTools::ConvertToUnixSlashes(&value);
            SetHomeOutputDirectory(this,&value);
            goto LAB_002e9726;
          }
          lVar5 = (long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5;
          if (uVar12 < lVar5 - 2U) {
            lVar5 = std::__cxx11::string::find((char *)pbVar9,0x513ee7);
            if (lVar5 == 0) {
              std::__cxx11::string::_M_assign((string *)&this->CheckBuildSystemArgument);
              uVar11 = uVar11 + 2;
              iVar4 = atoi((args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus._M_p);
              this->ClearBuildSystem = 0 < iVar4;
              uVar6 = extraout_RDX_01;
              goto LAB_002e9734;
            }
            lVar5 = (long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 5;
          }
          uVar6 = lVar5 - 1;
          if (uVar12 < uVar6) {
            lVar5 = std::__cxx11::string::find((char *)pbVar9,0x513efc);
            psVar10 = (string *)&this->CheckStampFile;
            if (lVar5 != 0) {
              uVar6 = ((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 5) - 1;
              goto LAB_002e94aa;
            }
          }
          else {
LAB_002e94aa:
            if ((uVar6 <= uVar12) ||
               (lVar5 = std::__cxx11::string::find((char *)pbVar9,0x513f0f),
               psVar10 = (string *)&this->CheckStampList, lVar5 != 0)) {
              auVar13 = std::__cxx11::string::find((char *)pbVar9,0x513c80);
              uVar6 = auVar13._8_8_;
              if (auVar13._0_8_ != 0) {
                auVar13 = std::__cxx11::string::find((char *)pbVar9,0x513d82);
                uVar6 = auVar13._8_8_;
                if (auVar13._0_8_ != 0) {
                  auVar13 = std::__cxx11::string::find((char *)pbVar9,0x513da3);
                  uVar6 = auVar13._8_8_;
                  if (auVar13._0_8_ != 0) {
                    auVar13 = std::__cxx11::string::find((char *)pbVar9,0x513de6);
                    uVar6 = auVar13._8_8_;
                    if (auVar13._0_8_ != 0) {
                      auVar13 = std::__cxx11::string::find((char *)pbVar9,0x513e0d);
                      uVar6 = auVar13._8_8_;
                      if (auVar13._0_8_ != 0) {
                        auVar13 = std::__cxx11::string::find((char *)pbVar9,0x513d34);
                        uVar6 = auVar13._8_8_;
                        if (auVar13._0_8_ == 0) goto LAB_002e9734;
                        lVar5 = std::__cxx11::string::find((char *)pbVar9,0x513f22);
                        if (lVar5 == 0) {
                          std::__cxx11::string::substr((ulong)&value,(ulong)pbVar9);
                          cmsys::SystemTools::CollapseFullPath(&local_50,&value);
                          std::__cxx11::string::operator=((string *)&value,(string *)&local_50);
                          std::__cxx11::string::~string((string *)&local_50);
                          cmsys::SystemTools::ConvertToUnixSlashes(&value);
                          std::__cxx11::string::_M_assign((string *)&this->GraphVizFile);
                          if ((this->GraphVizFile)._M_string_length == 0) {
                            cmSystemTools::Error
                                      ("No file specified for --graphviz",(char *)0x0,(char *)0x0,
                                       (char *)0x0);
                          }
                        }
                        else {
                          lVar5 = std::__cxx11::string::find((char *)pbVar9,0x513f4f);
                          if (lVar5 != 0) {
                            lVar5 = std::__cxx11::string::find((char *)pbVar9,0x513f5b);
                            if (lVar5 == 0) {
                              std::operator<<((ostream *)&std::cout,"debug trycompile on\n");
                              this->DebugTryCompile = true;
                              uVar6 = extraout_RDX_04;
                            }
                            else {
                              lVar5 = std::__cxx11::string::find((char *)pbVar9,0x513f83);
                              if (lVar5 == 0) {
                                std::operator<<((ostream *)&std::cout,
                                                "Running with debug output on.\n");
                                this->DebugOutput = true;
                                uVar6 = extraout_RDX_05;
                              }
                              else {
                                lVar5 = std::__cxx11::string::find((char *)pbVar9,0x513fb1);
                                if (lVar5 == 0) {
                                  std::operator<<((ostream *)&std::cout,
                                                  "Running with expanded trace output on.\n");
                                  this->Trace = true;
                                  this->TraceExpand = true;
                                  uVar6 = extraout_RDX_06;
                                }
                                else {
                                  lVar5 = std::__cxx11::string::find((char *)pbVar9,0x513fe8);
                                  if (lVar5 == 0) {
                                    std::__cxx11::string::substr((ulong)&value,(ulong)pbVar9);
                                    cmsys::SystemTools::ConvertToUnixSlashes(&value);
                                    std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::push_back(&this->TraceOnlyThisSources,&value);
                                    this->Trace = true;
                                    goto LAB_002e987a;
                                  }
                                  lVar5 = std::__cxx11::string::find((char *)pbVar9,0x513ff8);
                                  if (lVar5 == 0) {
                                    std::operator<<((ostream *)&std::cout,
                                                    "Running with trace output on.\n");
                                    this->Trace = true;
                                    this->TraceExpand = false;
                                    uVar6 = extraout_RDX_07;
                                  }
                                  else {
                                    lVar5 = std::__cxx11::string::find((char *)pbVar9,0x51401f);
                                    if (lVar5 == 0) {
                                      std::operator<<((ostream *)&std::cout,
                                                      "Warn about uninitialized values.\n");
                                      this->WarnUninitialized = true;
                                      uVar6 = extraout_RDX_08;
                                    }
                                    else {
                                      lVar5 = std::__cxx11::string::find((char *)pbVar9,0x514056);
                                      if (lVar5 == 0) {
                                        std::operator<<((ostream *)&std::cout,
                                                        "Finding unused variables.\n");
                                        this->WarnUnused = true;
                                        uVar6 = extraout_RDX_09;
                                      }
                                      else {
                                        lVar5 = std::__cxx11::string::find((char *)pbVar9,0x514084);
                                        if (lVar5 == 0) {
                                          poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                      
                                                  "Not searching for unused variables given on the "
                                                  );
                                          std::operator<<(poVar7,"command line.\n");
                                          this->WarnUnusedCli = false;
                                          uVar6 = extraout_RDX_10;
                                        }
                                        else {
                                          lVar5 = std::__cxx11::string::find
                                                            ((char *)pbVar9,0x5140d9);
                                          if (lVar5 == 0) {
                                            poVar7 = std::operator<<((ostream *)&std::cout,
                                                                                                                                          
                                                  "Also check system files when warning about unused and "
                                                  );
                                            std::operator<<(poVar7,"uninitialized variables.\n");
                                            this->CheckSystemVars = true;
                                            uVar6 = extraout_RDX_11;
                                          }
                                          else {
                                            lVar5 = std::__cxx11::string::find
                                                              ((char *)pbVar9,0x514158);
                                            if (lVar5 == 0) {
                                              std::__cxx11::string::substr
                                                        ((ulong)&value,(ulong)pbVar9);
                                              if (value._M_string_length == 0) {
                                                uVar11 = uVar11 + 1;
                                                if ((ulong)((long)(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start >> 5)
                                                  <= (ulong)uVar11) {
                                                  bVar1 = false;
                                                  cmSystemTools::Error
                                                            ("No platform specified for -A",
                                                             (char *)0x0,(char *)0x0,(char *)0x0);
                                                  goto LAB_002e9ba0;
                                                }
                                                std::__cxx11::string::_M_assign((string *)&value);
                                              }
                                              if (bVar2) {
                                                bVar1 = false;
                                                cmSystemTools::Error
                                                          ("Multiple -A options not allowed",
                                                           (char *)0x0,(char *)0x0,(char *)0x0);
                                                bVar2 = true;
                                              }
                                              else {
                                                bVar1 = true;
                                                std::__cxx11::string::_M_assign
                                                          ((string *)&this->GeneratorPlatform);
                                                bVar2 = true;
                                              }
                                            }
                                            else {
                                              lVar5 = std::__cxx11::string::find
                                                                ((char *)pbVar9,0x514194);
                                              if (lVar5 != 0) {
                                                lVar5 = std::__cxx11::string::find
                                                                  ((char *)pbVar9,0x5141d2);
                                                if (lVar5 != 0) {
                                                  SetDirectoriesFromFile
                                                            (this,(pbVar9->_M_dataplus)._M_p);
                                                  uVar6 = extraout_RDX;
                                                  goto LAB_002e972e;
                                                }
                                                std::__cxx11::string::substr
                                                          ((ulong)&value,(ulong)pbVar9);
                                                if (value._M_string_length == 0) {
                                                  uVar11 = uVar11 + 1;
                                                  if ((ulong)uVar11 <
                                                      (ulong)((long)(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start >> 5))
                                                  {
                                                    std::__cxx11::string::_M_assign
                                                              ((string *)&value);
                                                    goto LAB_002e9b16;
                                                  }
                                                  cmSystemTools::Error
                                                            ("No generator specified for -G",
                                                             (char *)0x0,(char *)0x0,(char *)0x0);
                                                  PrintGeneratorList(this);
                                                  bVar1 = false;
                                                }
                                                else {
LAB_002e9b16:
                                                  gg = CreateGlobalGenerator(this,&value);
                                                  if (gg == (cmGlobalGenerator *)0x0) {
                                                    cmSystemTools::Error
                                                              ("Could not create named generator ",
                                                               value._M_dataplus._M_p,(char *)0x0,
                                                               (char *)0x0);
                                                    bVar1 = true;
                                                    PrintGeneratorList(this);
                                                  }
                                                  else {
                                                    bVar1 = true;
                                                    SetGlobalGenerator(this,gg);
                                                  }
                                                }
                                                std::__cxx11::string::~string((string *)&value);
                                                uVar6 = extraout_RDX_13;
                                                if (!bVar1) {
                                                  return;
                                                }
                                                goto LAB_002e9734;
                                              }
                                              std::__cxx11::string::substr
                                                        ((ulong)&value,(ulong)pbVar9);
                                              if (value._M_string_length == 0) {
                                                uVar11 = uVar11 + 1;
                                                if ((ulong)((long)(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start >> 5)
                                                  <= (ulong)uVar11) {
                                                  bVar1 = false;
                                                  cmSystemTools::Error
                                                            ("No toolset specified for -T",
                                                             (char *)0x0,(char *)0x0,(char *)0x0);
                                                  goto LAB_002e9ba0;
                                                }
                                                std::__cxx11::string::_M_assign((string *)&value);
                                              }
                                              if (bVar3) {
                                                bVar1 = false;
                                                cmSystemTools::Error
                                                          ("Multiple -T options not allowed",
                                                           (char *)0x0,(char *)0x0,(char *)0x0);
                                                bVar3 = true;
                                              }
                                              else {
                                                bVar1 = true;
                                                std::__cxx11::string::_M_assign
                                                          ((string *)&this->GeneratorToolset);
                                                bVar3 = true;
                                              }
                                            }
LAB_002e9ba0:
                                            std::__cxx11::string::~string((string *)&value);
                                            uVar6 = extraout_RDX_12;
                                            if (!bVar1) {
                                              return;
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                            goto LAB_002e9734;
                          }
                          std::__cxx11::string::substr((ulong)&value,(ulong)pbVar9);
                          SetupDebugger(this,&value);
                        }
LAB_002e987a:
                        std::__cxx11::string::~string((string *)&value);
                        uVar6 = extraout_RDX_03;
                        goto LAB_002e9734;
                      }
                    }
                    uVar11 = uVar11 + 1;
                  }
                }
              }
              goto LAB_002e9734;
            }
          }
          uVar11 = uVar11 + 1;
          std::__cxx11::string::_M_assign(psVar10);
          uVar6 = extraout_RDX_02;
        }
      }
    }
LAB_002e9734:
    uVar12 = (ulong)(uVar11 + 1);
  } while( true );
}

Assistant:

void cmake::SetArgs(const std::vector<std::string>& args,
                    bool directoriesSetBefore)
{
  bool directoriesSet = directoriesSetBefore;
  bool haveToolset = false;
  bool havePlatform = false;
  for (unsigned int i = 1; i < args.size(); ++i) {
    std::string const& arg = args[i];
    if (arg.find("-H", 0) == 0) {
      directoriesSet = true;
      std::string path = arg.substr(2);
      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->SetHomeDirectory(path);
    } else if (arg.find("-S", 0) == 0) {
      // There is no local generate anymore.  Ignore -S option.
    } else if (arg.find("-O", 0) == 0) {
      // There is no local generate anymore.  Ignore -O option.
    } else if (arg.find("-B", 0) == 0) {
      directoriesSet = true;
      std::string path = arg.substr(2);
      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->SetHomeOutputDirectory(path);
    } else if ((i < args.size() - 2) &&
               (arg.find("--check-build-system", 0) == 0)) {
      this->CheckBuildSystemArgument = args[++i];
      this->ClearBuildSystem = (atoi(args[++i].c_str()) > 0);
    } else if ((i < args.size() - 1) &&
               (arg.find("--check-stamp-file", 0) == 0)) {
      this->CheckStampFile = args[++i];
    } else if ((i < args.size() - 1) &&
               (arg.find("--check-stamp-list", 0) == 0)) {
      this->CheckStampList = args[++i];
    }
#if defined(CMAKE_HAVE_VS_GENERATORS)
    else if ((i < args.size() - 1) &&
             (arg.find("--vs-solution-file", 0) == 0)) {
      this->VSSolutionFile = args[++i];
    }
#endif
    else if (arg.find("-D", 0) == 0) {
      // skip for now
    } else if (arg.find("-U", 0) == 0) {
      // skip for now
    } else if (arg.find("-C", 0) == 0) {
      // skip for now
    } else if (arg.find("-P", 0) == 0) {
      // skip for now
      i++;
    } else if (arg.find("--find-package", 0) == 0) {
      // skip for now
      i++;
    } else if (arg.find("-W", 0) == 0) {
      // skip for now
    } else if (arg.find("--graphviz=", 0) == 0) {
      std::string path = arg.substr(strlen("--graphviz="));
      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->GraphVizFile = path;
      if (this->GraphVizFile.empty()) {
        cmSystemTools::Error("No file specified for --graphviz");
      }
#if defined(HAVE_DEBUG_SERVER)
    } else if (arg.find("--debugger=", 0) == 0) {
      std::string connection = arg.substr(strlen("--debugger="));
      SetupDebugger(connection);
#endif
    } else if (arg.find("--debug-trycompile", 0) == 0) {
      std::cout << "debug trycompile on\n";
      this->DebugTryCompileOn();
    } else if (arg.find("--debug-output", 0) == 0) {
      std::cout << "Running with debug output on.\n";
      this->SetDebugOutputOn(true);
    } else if (arg.find("--trace-expand", 0) == 0) {
      std::cout << "Running with expanded trace output on.\n";
      this->SetTrace(true);
      this->SetTraceExpand(true);
    } else if (arg.find("--trace-source=", 0) == 0) {
      std::string file = arg.substr(strlen("--trace-source="));
      cmSystemTools::ConvertToUnixSlashes(file);
      this->AddTraceSource(file);
      this->SetTrace(true);
    } else if (arg.find("--trace", 0) == 0) {
      std::cout << "Running with trace output on.\n";
      this->SetTrace(true);
      this->SetTraceExpand(false);
    } else if (arg.find("--warn-uninitialized", 0) == 0) {
      std::cout << "Warn about uninitialized values.\n";
      this->SetWarnUninitialized(true);
    } else if (arg.find("--warn-unused-vars", 0) == 0) {
      std::cout << "Finding unused variables.\n";
      this->SetWarnUnused(true);
    } else if (arg.find("--no-warn-unused-cli", 0) == 0) {
      std::cout << "Not searching for unused variables given on the "
                << "command line.\n";
      this->SetWarnUnusedCli(false);
    } else if (arg.find("--check-system-vars", 0) == 0) {
      std::cout << "Also check system files when warning about unused and "
                << "uninitialized variables.\n";
      this->SetCheckSystemVars(true);
    } else if (arg.find("-A", 0) == 0) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No platform specified for -A");
          return;
        }
        value = args[i];
      }
      if (havePlatform) {
        cmSystemTools::Error("Multiple -A options not allowed");
        return;
      }
      this->GeneratorPlatform = value;
      havePlatform = true;
    } else if (arg.find("-T", 0) == 0) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No toolset specified for -T");
          return;
        }
        value = args[i];
      }
      if (haveToolset) {
        cmSystemTools::Error("Multiple -T options not allowed");
        return;
      }
      this->GeneratorToolset = value;
      haveToolset = true;
    } else if (arg.find("-G", 0) == 0) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No generator specified for -G");
          this->PrintGeneratorList();
          return;
        }
        value = args[i];
      }
      cmGlobalGenerator* gen = this->CreateGlobalGenerator(value);
      if (!gen) {
        cmSystemTools::Error("Could not create named generator ",
                             value.c_str());
        this->PrintGeneratorList();
      } else {
        this->SetGlobalGenerator(gen);
      }
    }
    // no option assume it is the path to the source
    else {
      directoriesSet = true;
      this->SetDirectoriesFromFile(arg.c_str());
    }
  }